

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  internalJSONNode *piVar3;
  JSONNode *pJVar4;
  size_t sVar5;
  
  piVar2 = this->internal;
  piVar3 = other->internal;
  if (piVar2 != piVar3) {
    if (piVar2->refcount < piVar3->refcount) {
      sVar5 = piVar2->refcount - 1;
      piVar2->refcount = sVar5;
      pJVar4 = other;
      other = this;
    }
    else {
      sVar5 = piVar3->refcount - 1;
      piVar3->refcount = sVar5;
      piVar2 = piVar3;
      pJVar4 = this;
    }
    if (sVar5 == 0) {
      internalJSONNode::deleteInternal(piVar2);
    }
    piVar2 = pJVar4->internal;
    psVar1 = &piVar2->refcount;
    *psVar1 = *psVar1 + 1;
    other->internal = piVar2;
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode &) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == other.internal) return;
	   JSON_ASSERT(*this == other, JSON_TEXT("merging two nodes that aren't equal"));
	   if (internal -> refcount < other.internal -> refcount){
		  *this = other;
	   } else {
		  other = *this;
	   }
    #endif
}